

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Path::resolve(Path *this,Value *root)

{
  uint uVar1;
  pointer pPVar2;
  ArrayIndex AVar3;
  pointer key;
  
  key = (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (key == pPVar2) {
      return root;
    }
    if (key->kind_ == kindKey) {
      if (*(char *)&root->bits_ != '\a') {
LAB_0086adbc:
        Value::nullSingleton();
        return &Value::nullSingleton::nullStatic;
      }
      root = Value::operator[](root,&key->key_);
      Value::nullSingleton();
      if (root == &Value::nullSingleton::nullStatic) goto LAB_0086adbc;
    }
    else if (key->kind_ == kindIndex) {
      if ((*(char *)&root->bits_ != '\x06') ||
         (uVar1 = key->index_, AVar3 = Value::size(root), AVar3 <= uVar1)) goto LAB_0086adbc;
      root = Value::operator[](root,key->index_);
    }
    key = key + 1;
  } while( true );
}

Assistant:

const Value& Path::resolve(const Value& root) const {
  const Value* node = &root;
  for (const auto& arg : args_) {
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_)) {
        // Error: unable to resolve path (array value expected at position... )
        return Value::nullSingleton();
      }
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject()) {
        // Error: unable to resolve path (object value expected at position...)
        return Value::nullSingleton();
      }
      node = &((*node)[arg.key_]);
      if (node == &Value::nullSingleton()) {
        // Error: unable to resolve path (object has no member named '' at
        // position...)
        return Value::nullSingleton();
      }
    }
  }
  return *node;
}